

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_exec
              (sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  uchar *puVar5;
  char *pcVar6;
  undefined8 in_RCX;
  code *in_RDX;
  sqlite3_stmt *in_RSI;
  long *in_R8;
  char *errmsg_1;
  int i_1;
  int i;
  char *errmsg;
  int nCol;
  char **azVals;
  char **azCols;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  int rc;
  int in_stack_000000a4;
  sqlite3_stmt *in_stack_000000a8;
  sqlite3_stmt *in_stack_00000238;
  char **in_stack_00000368;
  sqlite3_stmt **in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  sqlite3 *in_stack_00000388;
  sqlite3 *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar7;
  int local_68;
  int local_64;
  long lVar8;
  sqlite3_stmt *in_stack_ffffffffffffffc8;
  int local_2c;
  sqlite3_stmt *local_10;
  
  local_2c = 0;
  lVar8 = 0;
  local_10 = in_RSI;
  if (in_RSI == (sqlite3_stmt *)0x0) {
    local_10 = (sqlite3_stmt *)(anon_var_dwarf_3e39daf + 9);
  }
  while( true ) {
    do {
      while( true ) {
        uVar7 = false;
        if (local_2c == 0) {
          uVar7 = *(char *)&local_10->db != '\0';
        }
        if ((bool)uVar7 == false) goto LAB_029f6946;
        lVar8 = 0;
        local_2c = duckdb_shell_sqlite3_prepare_v2
                             (in_stack_00000388,in_stack_00000380,in_stack_0000037c,
                              in_stack_00000370,in_stack_00000368);
        if (local_2c == 0) break;
        if (in_R8 != (long *)0x0) {
          pcVar6 = duckdb_shell_sqlite3_errmsg(in_stack_ffffffffffffff78);
          if (pcVar6 == (char *)0x0) {
            in_stack_ffffffffffffff80 = (char *)0x0;
          }
          else {
            in_stack_ffffffffffffff80 = sqlite3_strdup(in_stack_ffffffffffffff80);
          }
          *in_R8 = (long)in_stack_ffffffffffffff80;
        }
      }
      local_10 = in_stack_ffffffffffffffc8;
    } while (lVar8 == 0);
    iVar1 = duckdb_shell_sqlite3_column_count((sqlite3_stmt *)in_stack_ffffffffffffff78);
    pvVar3 = malloc((long)iVar1 << 3);
    pvVar4 = malloc((long)iVar1 << 3);
    if ((pvVar3 == (void *)0x0) || (pvVar4 == (void *)0x0)) break;
    for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
      pcVar6 = duckdb_shell_sqlite3_column_name((sqlite3_stmt *)in_stack_ffffffffffffff78,0);
      *(char **)((long)pvVar3 + (long)local_64 * 8) = pcVar6;
    }
    while( true ) {
      local_2c = duckdb_shell_sqlite3_step(in_stack_00000238);
      if ((in_RDX != (code *)0x0) && (local_2c == 100)) {
        for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
          puVar5 = duckdb_shell_sqlite3_column_text(in_stack_000000a8,in_stack_000000a4);
          *(uchar **)((long)pvVar4 + (long)local_68 * 8) = puVar5;
          if ((*(long *)((long)pvVar4 + (long)local_68 * 8) == 0) &&
             (iVar2 = duckdb_shell_sqlite3_column_type
                                (in_stack_ffffffffffffffc8,(int)((ulong)lVar8 >> 0x20)), iVar2 != 5)
             ) {
            fprintf(_stderr,"sqlite3_exec: out of memory.\n");
            goto LAB_029f6946;
          }
        }
        iVar2 = (*in_RDX)(in_RCX,iVar1,pvVar4,pvVar3);
        if (iVar2 != 0) {
          local_2c = 4;
          duckdb_shell_sqlite3_finalize((sqlite3_stmt *)CONCAT17(uVar7,in_stack_ffffffffffffff88));
          lVar8 = 0;
          fprintf(_stderr,"sqlite3_exec: callback returned non-zero. Aborting.\n");
          goto LAB_029f6946;
        }
      }
      if (local_2c == 0x65) break;
      if (local_2c != 100) {
        if (in_R8 != (long *)0x0) {
          pcVar6 = duckdb_shell_sqlite3_errmsg(in_stack_ffffffffffffff78);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = sqlite3_strdup(in_stack_ffffffffffffff80);
          }
          *in_R8 = (long)pcVar6;
        }
        goto LAB_029f6946;
      }
    }
    local_2c = duckdb_shell_sqlite3_finalize
                         ((sqlite3_stmt *)CONCAT17(uVar7,in_stack_ffffffffffffff88));
    lVar8 = 0;
    local_10 = in_stack_ffffffffffffffc8;
    while (iVar1 = isspace((int)*(char *)&local_10->db), iVar1 != 0) {
      local_10 = (sqlite3_stmt *)((long)&local_10->db + 1);
    }
    duckdb_shell_sqlite3_free((void *)0x29f6923);
    duckdb_shell_sqlite3_free((void *)0x29f692d);
  }
LAB_029f6946:
  if (lVar8 != 0) {
    duckdb_shell_sqlite3_finalize((sqlite3_stmt *)CONCAT17(uVar7,in_stack_ffffffffffffff88));
  }
  duckdb_shell_sqlite3_free((void *)0x29f6962);
  duckdb_shell_sqlite3_free((void *)0x29f696c);
  if (((local_2c != 0) && (in_R8 != (long *)0x0)) && (*in_R8 == 0)) {
    pcVar6 = sqlite3_strdup(in_stack_ffffffffffffff80);
    *in_R8 = (long)pcVar6;
  }
  return local_2c;
}

Assistant:

int sqlite3_exec(sqlite3 *db,                /* The database on which the SQL executes */
                 const char *zSql,           /* The SQL to be executed */
                 sqlite3_callback xCallback, /* Invoke this callback routine */
                 void *pArg,                 /* First argument to xCallback() */
                 char **pzErrMsg             /* Write error messages here */
) {
	int rc = SQLITE_OK;            /* Return code */
	const char *zLeftover;         /* Tail of unprocessed SQL */
	sqlite3_stmt *pStmt = nullptr; /* The current SQL statement */
	char **azCols = nullptr;       /* Names of result columns */
	char **azVals = nullptr;       /* Result values */

	if (zSql == nullptr) {
		zSql = "";
	}

	while (rc == SQLITE_OK && zSql[0]) {
		int nCol;

		pStmt = nullptr;
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
		if (rc != SQLITE_OK) {
			if (pzErrMsg) {
				auto errmsg = sqlite3_errmsg(db);
				*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
			}
			continue;
		}
		if (!pStmt) {
			/* this happens for a comment or white-space */
			zSql = zLeftover;
			continue;
		}

		nCol = sqlite3_column_count(pStmt);
		azCols = (char **)malloc(nCol * sizeof(const char *));
		azVals = (char **)malloc(nCol * sizeof(const char *));
		if (!azCols || !azVals) {
			goto exec_out;
		}
		for (int i = 0; i < nCol; i++) {
			azCols[i] = (char *)sqlite3_column_name(pStmt, i);
		}

		while (true) {
			rc = sqlite3_step(pStmt);

			/* Invoke the callback function if required */
			if (xCallback && rc == SQLITE_ROW) {
				for (int i = 0; i < nCol; i++) {
					azVals[i] = (char *)sqlite3_column_text(pStmt, i);
					if (!azVals[i] && sqlite3_column_type(pStmt, i) != SQLITE_NULL) {
						fprintf(stderr, "sqlite3_exec: out of memory.\n");
						goto exec_out;
					}
				}
				if (xCallback(pArg, nCol, azVals, azCols)) {
					/* EVIDENCE-OF: R-38229-40159 If the callback function to
					** sqlite3_exec() returns non-zero, then sqlite3_exec() will
					** return SQLITE_ABORT. */
					rc = SQLITE_ABORT;
					sqlite3_finalize(pStmt);
					pStmt = 0;
					fprintf(stderr, "sqlite3_exec: callback returned non-zero. "
					                "Aborting.\n");
					goto exec_out;
				}
			}
			if (rc == SQLITE_DONE) {
				rc = sqlite3_finalize(pStmt);
				pStmt = nullptr;
				zSql = zLeftover;
				while (isspace(zSql[0]))
					zSql++;
				break;
			} else if (rc != SQLITE_ROW) {
				// error
				if (pzErrMsg) {
					auto errmsg = sqlite3_errmsg(db);
					*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
				}
				goto exec_out;
			}
		}

		sqlite3_free(azCols);
		sqlite3_free(azVals);
		azCols = nullptr;
		azVals = nullptr;
	}

exec_out:
	if (pStmt) {
		sqlite3_finalize(pStmt);
	}
	sqlite3_free(azCols);
	sqlite3_free(azVals);
	if (rc != SQLITE_OK && pzErrMsg && !*pzErrMsg) {
		// error but no error message set
		*pzErrMsg = sqlite3_strdup("Unknown error in DuckDB!");
	}
	return rc;
}